

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmValue.cxx
# Opt level: O3

bool __thiscall cmValue::IsOn(cmValue *this,string_view value)

{
  byte bVar1;
  byte *pbVar2;
  
  pbVar2 = (byte *)value._M_len;
  switch(this) {
  case (cmValue *)0x1:
    bVar1 = *pbVar2;
    if (((bVar1 == 0x31) || (bVar1 == 0x59)) || (bVar1 == 0x79)) {
      return true;
    }
    break;
  case (cmValue *)0x2:
    if ((*pbVar2 | 0x20) == 0x6f) {
      return (pbVar2[1] & 0xdf) == 0x4e;
    }
    break;
  case (cmValue *)0x3:
    if (((*pbVar2 | 0x20) == 0x79) && ((pbVar2[1] | 0x20) == 0x65)) {
      return (pbVar2[2] & 0xdf) == 0x53;
    }
    break;
  case (cmValue *)0x4:
    if ((((*pbVar2 | 0x20) == 0x74) && ((pbVar2[1] | 0x20) == 0x72)) && ((pbVar2[2] | 0x20) == 0x75)
       ) {
      return (pbVar2[3] & 0xdf) == 0x45;
    }
  }
  return false;
}

Assistant:

bool cmValue::IsOn(cm::string_view value) noexcept
{
  switch (value.size()) {
    case 1:
      return value[0] == '1' || value[0] == 'Y' || value[0] == 'y';
    case 2:
      return                                    //
        (value[0] == 'O' || value[0] == 'o') && //
        (value[1] == 'N' || value[1] == 'n');
    case 3:
      return                                    //
        (value[0] == 'Y' || value[0] == 'y') && //
        (value[1] == 'E' || value[1] == 'e') && //
        (value[2] == 'S' || value[2] == 's');
    case 4:
      return                                    //
        (value[0] == 'T' || value[0] == 't') && //
        (value[1] == 'R' || value[1] == 'r') && //
        (value[2] == 'U' || value[2] == 'u') && //
        (value[3] == 'E' || value[3] == 'e');
    default:
      break;
  }

  return false;
}